

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_log_internal_v(ggml_log_level level,char *format,__va_list_tag *args)

{
  int iVar1;
  char *__s;
  undefined8 *in_RDX;
  char *in_RSI;
  ggml_log_level in_EDI;
  char *buffer2;
  int len;
  char buffer [128];
  va_list args_copy;
  char local_b8 [128];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  char *local_10;
  ggml_log_level local_4;
  
  if (in_RSI != (char *)0x0) {
    local_28 = in_RDX[2];
    local_38 = *in_RDX;
    uStack_30 = in_RDX[1];
    local_10 = in_RSI;
    local_4 = in_EDI;
    iVar1 = vsnprintf(local_b8,0x80,in_RSI,in_RDX);
    if (iVar1 < 0x80) {
      (*g_logger_state.log_callback)(local_4,local_b8,g_logger_state.log_callback_user_data);
    }
    else {
      __s = (char *)calloc((long)(iVar1 + 1),1);
      vsnprintf(__s,(long)(iVar1 + 1),local_10,&local_38);
      __s[iVar1] = '\0';
      (*g_logger_state.log_callback)(local_4,__s,g_logger_state.log_callback_user_data);
      free(__s);
    }
  }
  return;
}

Assistant:

static void ggml_log_internal_v(enum ggml_log_level level, const char * format, va_list args) {
    if (format == NULL) {
        return;
    }
    va_list args_copy;
    va_copy(args_copy, args);
    char buffer[128];
    int len = vsnprintf(buffer, 128, format, args);
    if (len < 128) {
        g_logger_state.log_callback(level, buffer, g_logger_state.log_callback_user_data);
    } else {
        char * buffer2 = (char *) calloc(len + 1, sizeof(char));
        vsnprintf(buffer2, len + 1, format, args_copy);
        buffer2[len] = 0;
        g_logger_state.log_callback(level, buffer2, g_logger_state.log_callback_user_data);
        free(buffer2);
    }
    va_end(args_copy);
}